

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBindingModificationsKHR *value)

{
  XrInteractionProfileDpadBindingEXT *value_00;
  NextChainResult NVar1;
  uint uVar2;
  XrResult XVar3;
  ulong uVar4;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar5;
  allocator local_1a1;
  GenValidUsageXrInstanceInfo *local_1a0;
  string *local_198;
  string local_190;
  string error_message;
  allocator local_149;
  string local_148;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar5 = XR_SUCCESS;
  local_1a0 = instance_info;
  local_198 = command_name;
  if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBindingModificationsKHR",value->type,
               "VUID-XrBindingModificationsKHR-type-type",XR_TYPE_BINDING_MODIFICATIONS_KHR,
               "XR_TYPE_BINDING_MODIFICATIONS_KHR");
  }
  if (!check_pnext) goto LAB_0015a10c;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(local_1a0,local_198,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_190);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_190,local_1a0,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string
              ((string *)&local_190,"VUID-XrBindingModificationsKHR-next-unique",&local_1a1);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_148,
               "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct"
               ,&local_149);
    CoreValidLogMessage(local_1a0,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_190);
LAB_0015a0d7:
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrBindingModificationsKHR-next-next",
               (allocator *)&local_148);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_190,
               "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\""
               ,&local_1a1);
    CoreValidLogMessage(local_1a0,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_0015a0d7;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0015a10c:
  if (check_members && XVar5 == XR_SUCCESS) {
    uVar2 = value->bindingModificationCount;
    if (uVar2 == 0) {
      if (value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) {
        return XR_SUCCESS;
      }
    }
    else if (value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                 (allocator *)&local_148);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,objects_info);
      std::__cxx11::string::string
                ((string *)&local_190,
                 "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_1a0,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
LAB_0015a4c9:
      std::__cxx11::string::~string((string *)&error_message);
      return XR_ERROR_VALIDATION_FAILURE;
    }
    XVar5 = XR_SUCCESS;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      value_00 = (XrInteractionProfileDpadBindingEXT *)value->bindingModifications[uVar4];
      uVar2 = (uint)uVar4;
      if (value_00 == (XrInteractionProfileDpadBindingEXT *)0x0) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "Structure XrBindingModificationsKHR member bindingModifications",
                   (allocator *)&local_190);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::to_string(&local_190,uVar2);
        std::__cxx11::string::append((string *)&error_message);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::append((char *)&error_message);
        std::__cxx11::string::string
                  ((string *)&local_190,
                   "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                   (allocator *)&local_148);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_a8,objects_info);
        CoreValidLogMessage(local_1a0,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_a8,&error_message);
        this = &local_a8;
LAB_0015a4ba:
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(this);
        std::__cxx11::string::~string((string *)&local_190);
        goto LAB_0015a4c9;
      }
      if (value_00->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
        XVar3 = ValidateXrStruct(local_1a0,local_198,objects_info,true,true,
                                 (XrInteractionProfileAnalogThresholdVALVE *)value_00);
        if (XVar3 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,
                     "Structure XrBindingModificationsKHR member bindingModifications",
                     (allocator *)&local_190);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_190,uVar2);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_190,
                     "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                     (allocator *)&local_148);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_d8,objects_info);
          CoreValidLogMessage(local_1a0,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_d8,&error_message);
          this = &local_d8;
          goto LAB_0015a4ba;
        }
      }
      else if (value_00->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
        XVar3 = ValidateXrStruct(local_1a0,local_198,objects_info,true,true,value_00);
        if (XVar3 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,
                     "Structure XrBindingModificationsKHR member bindingModifications",
                     (allocator *)&local_190);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::to_string(&local_190,uVar2);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          std::__cxx11::string::string
                    ((string *)&local_190,
                     "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                     (allocator *)&local_148);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_c0,objects_info);
          CoreValidLogMessage(local_1a0,&local_190,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_c0,&error_message);
          this = &local_c0;
          goto LAB_0015a4ba;
        }
      }
      else {
        XVar3 = ValidateXrStruct(local_1a0,local_198,objects_info,true,false,
                                 (XrBindingModificationBaseHeaderKHR *)value_00);
        if (XVar3 != XR_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)&error_message,
                     "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                     (allocator *)&local_148);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_f0,objects_info);
          std::__cxx11::string::string
                    ((string *)&local_190,
                     "Structure XrBindingModificationsKHR member bindingModifications is invalid",
                     (allocator *)&valid_ext_structs);
          CoreValidLogMessage(local_1a0,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_198,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_f0,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~_Vector_base(&local_f0);
          std::__cxx11::string::~string((string *)&error_message);
          return XVar3;
        }
      }
      uVar2 = value->bindingModificationCount;
    }
  }
  return XVar5;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBindingModificationsKHR* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBindingModificationsKHR",
                             value->type, "VUID-XrBindingModificationsKHR-type-type", XR_TYPE_BINDING_MODIFICATIONS_KHR, "XR_TYPE_BINDING_MODIFICATIONS_KHR");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBindingModificationsKHR : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->bindingModificationCount is non-zero
    if (0 != value->bindingModificationCount && nullptr == value->bindingModifications) {
        CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->bindingModifications) {
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            if (value->bindingModifications[value_bindingmodifications_inc] == nullptr) {
                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                error_message += "[";
                error_message += std::to_string(value_bindingmodifications_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileDpadBindingEXT and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileDpadBindingEXT* const* new_interactionprofiledpadbindingext_value = reinterpret_cast<const XrInteractionProfileDpadBindingEXT* const*>(value->bindingModifications);
                    if (new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
                        if (nullptr != new_interactionprofiledpadbindingext_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileAnalogThresholdVALVE and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileAnalogThresholdVALVE* const* new_interactionprofileanalogthresholdvalve_value = reinterpret_cast<const XrInteractionProfileAnalogThresholdVALVE* const*>(value->bindingModifications);
                    if (new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
                        if (nullptr != new_interactionprofileanalogthresholdvalve_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrBindingModificationBaseHeaderKHR is valid
            if (nullptr != value->bindingModifications[value_bindingmodifications_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->bindingModifications[value_bindingmodifications_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrBindingModificationsKHR member bindingModifications is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}